

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlBufDumpAttributeDecl(xmlOutputBufferPtr buf,xmlAttributePtr attr)

{
  xmlAttributeDefault xVar1;
  int iVar2;
  char *pcVar3;
  
  xmlOutputBufferWrite(buf,10,"<!ATTLIST ");
  xmlOutputBufferWriteString(buf,(char *)attr->elem);
  xmlOutputBufferWrite(buf,1," ");
  if (attr->prefix != (xmlChar *)0x0) {
    xmlOutputBufferWriteString(buf,(char *)attr->prefix);
    xmlOutputBufferWrite(buf,1,":");
  }
  xmlOutputBufferWriteString(buf,(char *)attr->name);
  switch(attr->atype) {
  case XML_ATTRIBUTE_CDATA:
    pcVar3 = " CDATA";
    goto LAB_001699fa;
  case XML_ATTRIBUTE_ID:
    pcVar3 = " ID";
    iVar2 = 3;
    break;
  case XML_ATTRIBUTE_IDREF:
    pcVar3 = " IDREF";
LAB_001699fa:
    iVar2 = 6;
    break;
  case XML_ATTRIBUTE_IDREFS:
    pcVar3 = " IDREFS";
    goto LAB_00169a05;
  case XML_ATTRIBUTE_ENTITY:
    pcVar3 = " ENTITY";
LAB_00169a05:
    iVar2 = 7;
    break;
  case XML_ATTRIBUTE_ENTITIES:
    pcVar3 = " ENTITIES";
    goto LAB_00169a24;
  case XML_ATTRIBUTE_NMTOKEN:
    pcVar3 = " NMTOKEN";
    iVar2 = 8;
    break;
  case XML_ATTRIBUTE_NMTOKENS:
    pcVar3 = " NMTOKENS";
LAB_00169a24:
    iVar2 = 9;
    break;
  case XML_ATTRIBUTE_ENUMERATION:
    pcVar3 = " (";
    iVar2 = 2;
    goto LAB_00169abc;
  case XML_ATTRIBUTE_NOTATION:
    pcVar3 = " NOTATION (";
    iVar2 = 0xb;
LAB_00169abc:
    xmlOutputBufferWrite(buf,iVar2,pcVar3);
    xmlBufDumpEnumeration(buf,attr->tree);
  default:
    goto switchD_001699d1_default;
  }
  xmlOutputBufferWrite(buf,iVar2,pcVar3);
switchD_001699d1_default:
  xVar1 = attr->def;
  if (xVar1 == XML_ATTRIBUTE_FIXED) {
    pcVar3 = " #FIXED";
    iVar2 = 7;
  }
  else if (xVar1 == XML_ATTRIBUTE_IMPLIED) {
    pcVar3 = " #IMPLIED";
    iVar2 = 9;
  }
  else {
    if (xVar1 != XML_ATTRIBUTE_REQUIRED) goto LAB_00169a75;
    pcVar3 = " #REQUIRED";
    iVar2 = 10;
  }
  xmlOutputBufferWrite(buf,iVar2,pcVar3);
LAB_00169a75:
  if (attr->defaultValue != (xmlChar *)0x0) {
    xmlOutputBufferWrite(buf,1," ");
    xmlOutputBufferWriteQuotedString(buf,attr->defaultValue);
  }
  xmlOutputBufferWrite(buf,2,">\n");
  return;
}

Assistant:

static void
xmlBufDumpAttributeDecl(xmlOutputBufferPtr buf, xmlAttributePtr attr) {
    xmlOutputBufferWrite(buf, 10, "<!ATTLIST ");
    xmlOutputBufferWriteString(buf, (const char *) attr->elem);
    xmlOutputBufferWrite(buf, 1, " ");
    if (attr->prefix != NULL) {
	xmlOutputBufferWriteString(buf, (const char *) attr->prefix);
	xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *) attr->name);

    switch (attr->atype) {
	case XML_ATTRIBUTE_CDATA:
	    xmlOutputBufferWrite(buf, 6, " CDATA");
	    break;
	case XML_ATTRIBUTE_ID:
	    xmlOutputBufferWrite(buf, 3, " ID");
	    break;
	case XML_ATTRIBUTE_IDREF:
	    xmlOutputBufferWrite(buf, 6, " IDREF");
	    break;
	case XML_ATTRIBUTE_IDREFS:
	    xmlOutputBufferWrite(buf, 7, " IDREFS");
	    break;
	case XML_ATTRIBUTE_ENTITY:
	    xmlOutputBufferWrite(buf, 7, " ENTITY");
	    break;
	case XML_ATTRIBUTE_ENTITIES:
	    xmlOutputBufferWrite(buf, 9, " ENTITIES");
	    break;
	case XML_ATTRIBUTE_NMTOKEN:
	    xmlOutputBufferWrite(buf, 8, " NMTOKEN");
	    break;
	case XML_ATTRIBUTE_NMTOKENS:
	    xmlOutputBufferWrite(buf, 9, " NMTOKENS");
	    break;
	case XML_ATTRIBUTE_ENUMERATION:
	    xmlOutputBufferWrite(buf, 2, " (");
	    xmlBufDumpEnumeration(buf, attr->tree);
	    break;
	case XML_ATTRIBUTE_NOTATION:
	    xmlOutputBufferWrite(buf, 11, " NOTATION (");
	    xmlBufDumpEnumeration(buf, attr->tree);
	    break;
	default:
            /* assert(0); */
            break;
    }

    switch (attr->def) {
	case XML_ATTRIBUTE_NONE:
	    break;
	case XML_ATTRIBUTE_REQUIRED:
	    xmlOutputBufferWrite(buf, 10, " #REQUIRED");
	    break;
	case XML_ATTRIBUTE_IMPLIED:
	    xmlOutputBufferWrite(buf, 9, " #IMPLIED");
	    break;
	case XML_ATTRIBUTE_FIXED:
	    xmlOutputBufferWrite(buf, 7, " #FIXED");
	    break;
	default:
            /* assert(0); */
            break;
    }

    if (attr->defaultValue != NULL) {
	xmlOutputBufferWrite(buf, 1, " ");
	xmlOutputBufferWriteQuotedString(buf, attr->defaultValue);
    }

    xmlOutputBufferWrite(buf, 2, ">\n");
}